

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog_widgets.cpp
# Opt level: O2

Am_Value Am_Show_Dialog_And_Wait(Am_Object *the_dialog,bool modal)

{
  bool bVar1;
  Am_Object *this;
  bool in_DL;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  undefined7 in_register_00000031;
  Am_Value AVar2;
  Am_Object local_30;
  Am_Object cmd;
  
  Am_Object::Get_Object(&cmd,(Am_Slot_Key)(Am_Object *)CONCAT71(in_register_00000031,modal),0xc5);
  bVar1 = Am_Object::Valid(&cmd);
  if (bVar1) {
    this = Am_Object::Set(&cmd,0xca,do_stop_waiting_for_dialog.from_wrapper,1);
    Am_Object::Set(this,0xc9,do_abort_waiting_for_dialog.from_wrapper,1);
  }
  *(undefined2 *)&the_dialog->data = 0;
  the_dialog[1].data = (Am_Object_Data *)0x0;
  Am_Object::Am_Object(&local_30,(Am_Object *)CONCAT71(in_register_00000031,modal));
  Am_Pop_Up_Window_And_Wait(&local_30,(Am_Value *)the_dialog,in_DL);
  Am_Object::~Am_Object(&local_30);
  Am_Object::~Am_Object(&cmd);
  AVar2.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar2._0_8_ = the_dialog;
  return AVar2;
}

Assistant:

Am_Value
Am_Show_Dialog_And_Wait(Am_Object the_dialog, bool modal /*= false*/)
{
  Am_Object cmd = the_dialog.Peek_Object(Am_COMMAND);
  if (cmd.Valid()) {
    cmd.Set(Am_DO_METHOD, do_stop_waiting_for_dialog, Am_OK_IF_NOT_THERE)
        .Set(Am_ABORT_DO_METHOD, do_abort_waiting_for_dialog,
             Am_OK_IF_NOT_THERE);
  }
  Am_Value v;
  Am_Pop_Up_Window_And_Wait(the_dialog, v, modal);
  return v;
}